

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cc
# Opt level: O1

bool __thiscall
flow::lang::CallableSym::tryMatch(CallableSym *this,ParamList *params,string *errorMessage)

{
  string *name;
  long *plVar1;
  char cVar2;
  NativeCallback *this_00;
  pointer puVar3;
  pointer pbVar4;
  pointer pvVar5;
  undefined8 uVar6;
  pointer pLVar7;
  bool bVar8;
  LiteralType LVar9;
  LiteralType LVar10;
  Signature *pSVar11;
  Signature *pSVar12;
  ulong uVar13;
  ulong uVar14;
  iterator __begin4;
  pointer pLVar15;
  pointer puVar16;
  iterator __end4;
  long lVar17;
  long lVar18;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  string t;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  superfluous;
  Signature sig;
  Signature *local_318;
  code *pcStack_310;
  undefined1 local_308 [32];
  vector<flow::LiteralType,_std::allocator<flow::LiteralType>_> local_2e8;
  Signature *local_2c8;
  ulong local_2c0;
  undefined1 local_2b8 [24];
  code *pcStack_2a0;
  LiteralType local_298;
  vector<flow::LiteralType,_std::allocator<flow::LiteralType>_> local_290;
  Signature *local_270;
  long *local_268 [2];
  long local_258 [2];
  undefined **local_248;
  undefined1 *local_240;
  long lStack_238;
  ulong local_230;
  undefined1 local_228 [504];
  
  this_00 = this->nativeCallback_;
  if (((params->values_).
       super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (params->values_).
       super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     ((bVar8 = true, this_00 != (NativeCallback *)0x0 &&
      (pSVar11 = NativeCallback::signature(this_00),
      (pSVar11->args_).super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pSVar11->args_).super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
      _M_impl.super__Vector_impl_data._M_finish)))) {
    local_308._24_8_ = errorMessage;
    if (params->isNamed_ == true) {
      if ((this_00->names_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this_00->names_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (this->nativeCallback_ == (NativeCallback *)0x0) {
          pSVar11 = &this->sig_;
        }
        else {
          pSVar11 = NativeCallback::signature(this->nativeCallback_);
        }
        uVar14 = (ulong)((long)(pSVar11->args_).
                               super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pSVar11->args_).
                              super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 2;
        if ((int)uVar14 != 0) {
          local_270 = &this->sig_;
          local_2c0 = uVar14 & 0xffffffff;
          lVar17 = 0;
          lVar18 = 0;
          uVar14 = 0;
          do {
            pbVar4 = (this_00->names_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(this_00->names_).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) <=
                uVar14) {
LAB_0012f000:
              __assert_fail("i < names_.size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/NativeCallback.h"
                            ,0x15a,
                            "const std::string &flow::NativeCallback::getParamNameAt(size_t) const")
              ;
            }
            name = (string *)((long)&(pbVar4->_M_dataplus)._M_p + lVar18);
            bVar8 = ParamList::contains(params,name);
            if (!bVar8) {
              pvVar5 = (this_00->defaults_).
                       super__Vector_base<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>,_std::allocator<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar13 = ((long)(this_00->defaults_).
                              super__Vector_base<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>,_std::allocator<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
                       0x2e8ba2e8ba2e8ba3;
              if (uVar13 < uVar14 || uVar13 - uVar14 == 0) {
LAB_0012f01f:
                __assert_fail("i < defaults_.size()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/NativeCallback.h"
                              ,0x15f,
                              "const NativeCallback::DefaultValue &flow::NativeCallback::getDefaultParamAt(size_t) const"
                             );
              }
              cVar2 = *(char *)((long)&(pvVar5->
                                       super__Variant_base<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                                       ).
                                       super__Move_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                                       .
                                       super__Copy_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                               + lVar17 + 0x50);
              local_2c8 = (Signature *)CONCAT71(local_2c8._1_7_,cVar2);
              if (cVar2 == '\0') {
                local_2b8._0_8_ = (this->super_Symbol).name_._M_dataplus._M_p;
                local_2b8._8_8_ = (this->super_Symbol).name_._M_string_length;
                plVar1 = (long *)((long)&(pbVar4->_M_dataplus)._M_p + lVar18);
                local_2b8._16_8_ = *plVar1;
                pcStack_2a0 = (code *)plVar1[1];
                lStack_238 = 0;
                local_248 = &PTR_grow_00194440;
                local_230 = 500;
                format_str_00.size_ = 0x3a;
                format_str_00.data_ =
                     "Callee \"{}\" invoked without required named parameter \"{}\".";
                args_00.field_1.values_ =
                     (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                      *)local_2b8;
                args_00.types_ = 0xbb;
                local_240 = local_228;
                fmt::v5::
                vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                          ((range)&local_248,format_str_00,args_00);
                local_318 = (Signature *)local_308;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_318,local_240,local_240 + lStack_238);
                uVar6 = local_308._24_8_;
                local_248 = &PTR_grow_00194440;
                if (local_240 != local_228) {
                  operator_delete(local_240,local_230);
                }
                std::__cxx11::string::operator=((string *)uVar6,(string *)&local_318);
                if (local_318 != (Signature *)local_308) {
                  operator_delete(local_318,(ulong)(local_308._0_8_ + 1));
                }
              }
              else {
                pSVar11 = local_270;
                if (this->nativeCallback_ != (NativeCallback *)0x0) {
                  pSVar11 = NativeCallback::signature(this->nativeCallback_);
                }
                completeDefaultValue
                          (params,(pSVar11->args_).
                                  super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar14],
                           (DefaultValue *)
                           ((long)&(pvVar5->
                                   super__Variant_base<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                                   ).
                                   super__Move_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                                   .
                                   super__Copy_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                           + lVar17),name);
              }
              if ((char)local_2c8 == '\0') goto LAB_0012eaa6;
            }
            uVar14 = uVar14 + 1;
            lVar18 = lVar18 + 0x20;
            lVar17 = lVar17 + 0x58;
          } while (local_2c0 != uVar14);
        }
        local_2e8.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2e8.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2e8.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ParamList::reorder(params,this_00,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_2e8);
        pLVar7 = local_2e8.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar8 = local_2e8.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                local_2e8.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                _M_impl.super__Vector_impl_data._M_finish;
        if (!bVar8) {
          local_318 = (Signature *)local_308;
          pcStack_310 = (code *)0x0;
          local_308._0_8_ = local_308._0_8_ & 0xffffffffffffff00;
          pLVar15 = local_2e8.
                    super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            if (pcStack_310 != (code *)0x0) {
              std::__cxx11::string::append((char *)&local_318);
            }
            std::__cxx11::string::append((char *)&local_318);
            std::__cxx11::string::_M_append((char *)&local_318,*(undefined8 *)pLVar15);
            std::__cxx11::string::append((char *)&local_318);
            pLVar15 = pLVar15 + 8;
          } while (pLVar15 != pLVar7);
          local_2b8._0_8_ = (this->super_Symbol).name_._M_dataplus._M_p;
          local_2b8._8_8_ = (this->super_Symbol).name_._M_string_length;
          local_2b8._16_8_ = local_318;
          pcStack_2a0 = pcStack_310;
          lStack_238 = 0;
          local_248 = &PTR_grow_00194440;
          local_230 = 500;
          format_str_01.size_ = 0x30;
          format_str_01.data_ = "Superfluous arguments passed to callee \"{}\": {}.";
          args_01.field_1.values_ =
               (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                *)local_2b8;
          args_01.types_ = 0xbb;
          local_240 = local_228;
          fmt::v5::
          vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    ((range)&local_248,format_str_01,args_01);
          local_268[0] = local_258;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_268,local_240,local_240 + lStack_238);
          local_248 = &PTR_grow_00194440;
          if (local_240 != local_228) {
            operator_delete(local_240,local_230);
          }
          std::__cxx11::string::operator=((string *)local_308._24_8_,(string *)local_268);
          if (local_268[0] != local_258) {
            operator_delete(local_268[0],local_258[0] + 1);
          }
          if (local_318 != (Signature *)local_308) {
            operator_delete(local_318,(ulong)(local_308._0_8_ + 1));
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_2e8);
        return bVar8;
      }
      local_318 = (Signature *)(this->super_Symbol).name_._M_dataplus._M_p;
      pcStack_310 = (code *)(this->super_Symbol).name_._M_string_length;
      local_240 = local_228;
      lStack_238 = 0;
      local_248 = &PTR_grow_00194440;
      local_230 = 500;
      format_str.size_ = 0x4c;
      format_str.data_ =
           "Callee \"{}\" invoked with named parameters, but no names provided by runtime.";
      args.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_318;
      args.types_ = 0xb;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_248,format_str,args);
      local_2b8._0_8_ = local_2b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2b8,local_240,local_240 + lStack_238);
    }
    else {
      puVar16 = (params->values_).
                super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      puVar3 = (params->values_).
               super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (this->nativeCallback_ == (NativeCallback *)0x0) {
        pSVar11 = &this->sig_;
      }
      else {
        pSVar11 = NativeCallback::signature(this->nativeCallback_);
      }
      if ((ulong)((long)puVar16 - (long)puVar3 >> 3) <=
          (ulong)((long)(pSVar11->args_).
                        super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(pSVar11->args_).
                        super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2)) {
        lVar17 = (long)(params->values_).
                       super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(params->values_).
                       super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if (lVar17 != 0) {
          pSVar11 = (Signature *)0x1;
          do {
            pSVar12 = &this->sig_;
            if (this->nativeCallback_ != (NativeCallback *)0x0) {
              pSVar12 = NativeCallback::signature(this->nativeCallback_);
            }
            LVar10 = (pSVar12->args_).
                     super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                     _M_impl.super__Vector_impl_data._M_start
                     [(long)((long)&pSVar11[-1].args_.
                                    super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                                    ._M_impl + 0x17)];
            LVar9 = (**(code **)(*(long *)(params->values_).
                                          super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start
                                          [(long)((long)&pSVar11[-1].args_.
                                                                                                                  
                                                  super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                                                  ._M_impl + 0x17)]._M_t.
                                          super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                                          ._M_t + 0x18))();
            if (LVar9 != LVar10) {
              if (this->nativeCallback_ == (NativeCallback *)0x0) {
                local_2b8._16_8_ = &this->sig_;
              }
              else {
                local_2b8._16_8_ = NativeCallback::signature(this->nativeCallback_);
              }
              pcStack_2a0 = fmt::v5::internal::
                            value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                            ::format_custom_arg<flow::Signature>;
              lStack_238 = 0;
              local_248 = &PTR_grow_00194440;
              local_230 = 500;
              format_str_04.size_ = 0x34;
              format_str_04.data_ = "Type mismatch in positional parameter {}, callee {}.";
              args_04.field_1.values_ =
                   (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                    *)local_2b8;
              args_04.types_ = 0xd5;
              local_2b8._0_8_ = pSVar11;
              local_240 = local_228;
              fmt::v5::
              vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                        ((range)&local_248,format_str_04,args_04);
              local_318 = (Signature *)local_308;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_318,local_240,local_240 + lStack_238);
              local_248 = &PTR_grow_00194440;
              if (local_240 != local_228) {
                operator_delete(local_240,local_230);
              }
              std::__cxx11::string::operator=((string *)errorMessage,(string *)&local_318);
              pSVar11 = local_318;
              if (local_318 == (Signature *)local_308) goto LAB_0012eaa6;
              goto LAB_0012ea9e;
            }
            bVar8 = pSVar11 != (Signature *)(lVar17 >> 3);
            pSVar11 = (Signature *)((long)&(pSVar11->name_)._M_dataplus._M_p + 1);
          } while (bVar8);
        }
        uVar14 = (long)(params->values_).
                       super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(params->values_).
                       super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        if (this->nativeCallback_ == (NativeCallback *)0x0) {
          pSVar11 = &this->sig_;
        }
        else {
          pSVar11 = NativeCallback::signature(this->nativeCallback_);
        }
        local_2c0 = (long)(pSVar11->args_).
                          super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(pSVar11->args_).
                          super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2;
        if (uVar14 != local_2c0) {
          local_2c8 = &this->sig_;
          lVar17 = uVar14 * 0x58;
          lVar18 = uVar14 << 5;
          do {
            pvVar5 = (this_00->defaults_).
                     super__Vector_base<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>,_std::allocator<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar13 = ((long)(this_00->defaults_).
                            super__Vector_base<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>,_std::allocator<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
                     0x2e8ba2e8ba2e8ba3;
            if (uVar13 < uVar14 || uVar13 - uVar14 == 0) goto LAB_0012f01f;
            cVar2 = *(char *)((long)&(pvVar5->
                                     super__Variant_base<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                                     ).
                                     super__Move_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                                     .
                                     super__Copy_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                             + lVar17 + 0x50);
            if (cVar2 == '\0') {
              pSVar11 = local_2c8;
              if (this->nativeCallback_ != (NativeCallback *)0x0) {
                pSVar11 = NativeCallback::signature(this->nativeCallback_);
              }
              local_2b8._0_8_ = uVar14 + 1;
              pcStack_2a0 = fmt::v5::internal::
                            value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                            ::format_custom_arg<flow::Signature>;
              lStack_238 = 0;
              local_248 = &PTR_grow_00194440;
              local_240 = local_228;
              local_230 = 500;
              format_str_03.size_ = 0x41;
              format_str_03.data_ =
                   "No default value provided for positional parameter {}, callee {}.";
              args_03.field_1.values_ =
                   (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                    *)local_2b8;
              args_03.types_ = 0xd5;
              local_2b8._16_8_ = pSVar11;
              fmt::v5::
              vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                        ((range)&local_248,format_str_03,args_03);
              local_318 = (Signature *)local_308;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_318,local_240,local_240 + lStack_238);
              local_248 = &PTR_grow_00194440;
              if (local_240 != local_228) {
                operator_delete(local_240,local_230);
              }
              std::__cxx11::string::operator=((string *)local_308._24_8_,(string *)&local_318);
              if (local_318 != (Signature *)local_308) {
                operator_delete(local_318,(ulong)(local_308._0_8_ + 1));
              }
            }
            else {
              pbVar4 = (this_00->names_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(this_00->names_).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) <=
                  uVar14) goto LAB_0012f000;
              pSVar11 = NativeCallback::signature(this_00);
              completeDefaultValue
                        (params,(pSVar11->args_).
                                super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar14],
                         (DefaultValue *)
                         ((long)&(pvVar5->
                                 super__Variant_base<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                                 ).
                                 super__Move_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                                 .
                                 super__Copy_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                         + lVar17),(string *)((long)&(pbVar4->_M_dataplus)._M_p + lVar18));
            }
            if (cVar2 == '\0') goto LAB_0012eaa6;
            uVar14 = uVar14 + 1;
            lVar17 = lVar17 + 0x58;
            lVar18 = lVar18 + 0x20;
          } while (local_2c0 != uVar14);
        }
        Signature::Signature((Signature *)local_2b8);
        std::__cxx11::string::_M_assign((string *)local_2b8);
        uVar6 = local_308._24_8_;
        if (this->nativeCallback_ == (NativeCallback *)0x0) {
          pSVar11 = &this->sig_;
        }
        else {
          pSVar11 = NativeCallback::signature(this->nativeCallback_);
        }
        local_298 = pSVar11->returnType_;
        local_2e8.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2e8.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>._M_impl.
        super__Vector_impl_data._M_finish = (LiteralType *)0x0;
        local_2e8.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (LiteralType *)0x0;
        puVar16 = (params->values_).
                  super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar3 = (params->values_).
                 super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar16 != puVar3) {
          do {
            LVar10 = (**(code **)((long)(((puVar16->_M_t).
                                          super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
                                          .super__Head_base<0UL,_flow::lang::Expr_*,_false>.
                                         _M_head_impl)->super_ASTNode)._vptr_ASTNode + 0x18))();
            local_248 = (undefined **)CONCAT44(local_248._4_4_,LVar10);
            if (local_2e8.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_2e8.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::
              _M_realloc_insert<flow::LiteralType>
                        (&local_2e8,
                         (iterator)
                         local_2e8.
                         super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(LiteralType *)&local_248);
            }
            else {
              *local_2e8.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
               _M_impl.super__Vector_impl_data._M_finish = LVar10;
              local_2e8.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_2e8.
                   super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            puVar16 = puVar16 + 1;
          } while (puVar16 != puVar3);
        }
        std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::operator=
                  (&local_290,&local_2e8);
        if (this->nativeCallback_ == (NativeCallback *)0x0) {
          pSVar11 = &this->sig_;
        }
        else {
          pSVar11 = NativeCallback::signature(this->nativeCallback_);
        }
        bVar8 = Signature::operator!=((Signature *)local_2b8,pSVar11);
        if (bVar8) {
          if (this->nativeCallback_ == (NativeCallback *)0x0) {
            local_308._0_8_ = &this->sig_;
          }
          else {
            local_308._0_8_ = NativeCallback::signature(this->nativeCallback_);
          }
          pcStack_310 = fmt::v5::internal::
                        value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                        ::format_custom_arg<flow::Signature>;
          local_308._8_8_ =
               fmt::v5::internal::
               value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               ::format_custom_arg<flow::Signature>;
          lStack_238 = 0;
          local_248 = &PTR_grow_00194440;
          local_230 = 500;
          format_str_05.size_ = 0x45;
          format_str_05.data_ =
               "Callee parameter type signature mismatch: {} passed, but {} expected.";
          args_05.field_1.values_ =
               (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                *)&local_318;
          args_05.types_ = 0xdd;
          local_318 = (Signature *)local_2b8;
          local_240 = local_228;
          fmt::v5::
          vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    ((range)&local_248,format_str_05,args_05);
          local_268[0] = local_258;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_268,local_240,local_240 + lStack_238);
          local_248 = &PTR_grow_00194440;
          if (local_240 != local_228) {
            operator_delete(local_240,local_230);
          }
          std::__cxx11::string::operator=((string *)uVar6,(string *)local_268);
          if (local_268[0] != local_258) {
            operator_delete(local_268[0],local_258[0] + 1);
          }
        }
        if (local_2e8.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2e8.
                          super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_2e8.
                                super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2e8.
                                super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_290.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_290.
                          super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_290.
                                super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_290.
                                super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
          operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
        }
        return !bVar8;
      }
      if (this->nativeCallback_ == (NativeCallback *)0x0) {
        local_318 = &this->sig_;
      }
      else {
        local_318 = NativeCallback::signature(this->nativeCallback_);
      }
      pcStack_310 = fmt::v5::internal::
                    value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                    ::format_custom_arg<flow::Signature>;
      local_240 = local_228;
      lStack_238 = 0;
      local_248 = &PTR_grow_00194440;
      local_230 = 500;
      format_str_02.size_ = 0x24;
      format_str_02.data_ = "Superfluous parameters to callee {}.";
      args_02.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_318;
      args_02.types_ = 0xd;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_248,format_str_02,args_02);
      local_2b8._0_8_ = local_2b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2b8,local_240,local_240 + lStack_238);
    }
    local_248 = &PTR_grow_00194440;
    if (local_240 != local_228) {
      operator_delete(local_240,local_230);
    }
    std::__cxx11::string::operator=((string *)errorMessage,(string *)local_2b8);
    local_308._0_8_ = local_2b8._16_8_;
    pSVar11 = (Signature *)local_2b8._0_8_;
    if ((Signature *)local_2b8._0_8_ != (Signature *)(local_2b8 + 0x10)) {
LAB_0012ea9e:
      operator_delete(pSVar11,(ulong)((long)&(((Signature *)local_308._0_8_)->name_)._M_dataplus.
                                             _M_p + 1));
    }
LAB_0012eaa6:
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool CallableSym::tryMatch(ParamList& params, std::string* errorMessage) const {
  // printf("CallableSym(%s).tryMatch()\n", name().c_str());

  const NativeCallback* native = nativeCallback();

  if (params.empty() && (!native || native->signature().args().empty()))
    return true;

  if (params.isNamed()) {
    if (!native->parametersNamed()) {
      *errorMessage = fmt::format(
          "Callee \"{}\" invoked with named parameters, but no names provided "
          "by runtime.",
          name());
      return false;
    }

    int argc = signature().args().size();
    for (int i = 0; i != argc; ++i) {
      const auto& paramName = native->getParamNameAt(i);
      if (!params.contains(paramName)) {
        const NativeCallback::DefaultValue& defaultValue =
            native->getDefaultParamAt(i);
        if (std::holds_alternative<std::monostate>(defaultValue)) {
          *errorMessage = fmt::format(
              "Callee \"{}\" invoked without required named parameter \"{}\".",
              name(), paramName);
          return false;
        }
        LiteralType type = signature().args()[i];
        completeDefaultValue(params, type, defaultValue, paramName);
      }
    }

    // reorder params (and detect superfluous params)
    std::vector<std::string> superfluous;
    params.reorder(native, &superfluous);

    if (!superfluous.empty()) {
      std::string t;
      for (const auto& s : superfluous) {
        if (!t.empty()) t += ", ";
        t += "\"";
        t += s;
        t += "\"";
      }
      *errorMessage = fmt::format(
          "Superfluous arguments passed to callee \"{}\": {}.", name(), t);
      return false;
    }

    return true;
  } else  // verify params positional
  {
    if (params.size() > signature().args().size()) {
      *errorMessage = fmt::format("Superfluous parameters to callee {}.", signature());
      return false;
    }

    for (size_t i = 0, e = params.size(); i != e; ++i) {
      LiteralType expectedType = signature().args()[i];
      LiteralType givenType = params.values()[i]->getType();
      if (givenType != expectedType) {
        *errorMessage = fmt::format(
            "Type mismatch in positional parameter {}, callee {}.",
            i + 1, signature());
        return false;
      }
    }

    for (size_t i = params.size(), e = signature().args().size(); i != e; ++i) {
      const NativeCallback::DefaultValue& defaultValue = native->getDefaultParamAt(i);
      if (std::holds_alternative<std::monostate>(defaultValue)) {
        *errorMessage = fmt::format(
            "No default value provided for positional parameter {}, callee {}.",
            i + 1, signature());
        return false;
      }

      const std::string& name = native->getParamNameAt(i);
      LiteralType type = native->signature().args()[i];
      completeDefaultValue(params, type, defaultValue, name);
    }

    Signature sig;
    sig.setName(this->name());
    sig.setReturnType(signature().returnType());  // XXX cheetah
    std::vector<LiteralType> argTypes;
    for (const auto& arg : params.values()) {
      argTypes.push_back(arg->getType());
    }
    sig.setArgs(argTypes);

    if (sig != signature()) {
      *errorMessage = fmt::format(
          "Callee parameter type signature mismatch: {} passed, but {} expected.",
          sig, signature());
      return false;
    }

    return true;
  }
}